

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libypspur-md.c
# Opt level: O0

void YP_md_request_device_dump(YPSpur *spur,int id,int block)

{
  int iVar1;
  undefined1 auStack_50 [4];
  int len;
  YPSpur_msg msg;
  int block_local;
  int id_local;
  YPSpur *spur_local;
  
  _auStack_50 = 1;
  msg.msg_type = (long)spur->pid;
  msg.pid._0_4_ = 0x504;
  msg._16_8_ = (BADTYPE)id;
  msg.data[0] = (double)block;
  msg.pid._4_4_ = 0;
  msg.data[3]._0_4_ = block;
  msg.data[3]._4_4_ = id;
  iVar1 = (*(spur->dev).send)(&spur->dev,(YPSpur_msg *)auStack_50);
  if (iVar1 < 0) {
    spur->connection_error = 1;
  }
  return;
}

Assistant:

void YP_md_request_device_dump(YPSpur* spur, int id, int block)
{
  YPSpur_msg msg;
  int len;

  msg.msg_type = YPSPUR_MSG_CMD;
  msg.pid = spur->pid;
  msg.type = YPSPUR_REQUEST_DEVICE_DUMP;
  msg.data[0] = id;
  msg.data[1] = block;
  msg.cs = 0;
  if (spur->dev.send(&spur->dev, &msg) < 0)
  {
    /* error */
    spur->connection_error = 1;
  }
}